

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_6be18a::GetList
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list,string *var,cmMakefile *makefile)

{
  undefined8 this;
  bool bVar1;
  PolicyStatus PVar2;
  ulong uVar3;
  PolicyID id;
  PolicyID id_00;
  string_view sVar4;
  string local_168;
  string_view local_148;
  cmAlphaNum local_138;
  string local_108;
  cmAlphaNum local_e8;
  undefined1 local_b8 [8];
  string warn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string_view local_68;
  undefined4 local_58;
  undefined1 local_48 [8];
  string listString;
  cmMakefile *makefile_local;
  string *var_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list_local;
  
  listString.field_2._8_8_ = makefile;
  std::__cxx11::string::string((string *)local_48);
  bVar1 = GetListString((string *)local_48,var,(cmMakefile *)listString.field_2._8_8_);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_68 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
      cmExpandList(local_68,list,true);
      std::__cxx11::string::string((string *)&local_88);
      bVar1 = ::cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (list,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        PVar2 = cmMakefile::GetPolicyStatus((cmMakefile *)listString.field_2._8_8_,CMP0007,false);
        this = listString.field_2._8_8_;
        sVar4._M_str = local_148._M_str;
        sVar4._M_len = local_148._M_len;
        switch(PVar2) {
        case OLD:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(list);
          local_148 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
          cmExpandList(local_148,list,false);
          list_local._7_1_ = true;
          local_58 = 1;
          break;
        case WARN:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(list);
          sVar4 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
          warn.field_2._8_8_ = sVar4._M_len;
          cmExpandList(sVar4,list,false);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_108,(cmPolicies *)0x7,id_00);
          cmAlphaNum::cmAlphaNum(&local_e8,&local_108);
          cmAlphaNum::cmAlphaNum(&local_138," List has value = [");
          cmStrCat<std::__cxx11::string,char[3]>
                    ((string *)local_b8,&local_e8,&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     (char (*) [3])0xc047e2);
          std::__cxx11::string::~string((string *)&local_108);
          cmMakefile::IssueMessage
                    ((cmMakefile *)listString.field_2._8_8_,AUTHOR_WARNING,(string *)local_b8);
          list_local._7_1_ = true;
          local_58 = 1;
          std::__cxx11::string::~string((string *)local_b8);
          break;
        case NEW:
          list_local._7_1_ = true;
          local_58 = 1;
          break;
        case REQUIRED_IF_USED:
        case REQUIRED_ALWAYS:
          cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_168,(cmPolicies *)0x7,id);
          cmMakefile::IssueMessage((cmMakefile *)this,FATAL_ERROR,&local_168);
          std::__cxx11::string::~string((string *)&local_168);
          list_local._7_1_ = false;
          local_58 = 1;
          break;
        default:
          list_local._7_1_ = true;
          local_58 = 1;
          local_148 = sVar4;
        }
      }
      else {
        list_local._7_1_ = true;
        local_58 = 1;
      }
    }
    else {
      list_local._7_1_ = true;
      local_58 = 1;
    }
  }
  else {
    list_local._7_1_ = false;
    local_58 = 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return list_local._7_1_;
}

Assistant:

bool GetList(std::vector<std::string>& list, const std::string& var,
             const cmMakefile& makefile)
{
  std::string listString;
  if (!GetListString(listString, var, makefile)) {
    return false;
  }
  // if the size of the list
  if (listString.empty()) {
    return true;
  }
  // expand the variable into a list
  cmExpandList(listString, list, true);
  // if no empty elements then just return
  if (!cm::contains(list, std::string())) {
    return true;
  }
  // if we have empty elements we need to check policy CMP0007
  switch (makefile.GetPolicyStatus(cmPolicies::CMP0007)) {
    case cmPolicies::WARN: {
      // Default is to warn and use old behavior
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list.clear();
      cmExpandList(listString, list);
      std::string warn =
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0007),
                 " List has value = [", listString, "].");
      makefile.IssueMessage(MessageType::AUTHOR_WARNING, warn);
      return true;
    }
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list.clear();
      cmExpandList(listString, list);
      return true;
    case cmPolicies::NEW:
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0007));
      return false;
  }
  return true;
}